

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O2

KeywordVersion slang::parsing::LexerFacts::getDefaultKeywordVersion(LanguageVersion languageVersion)

{
  return v1800_2023 - (languageVersion == Default);
}

Assistant:

KeywordVersion LexerFacts::getDefaultKeywordVersion(LanguageVersion languageVersion) {
    switch (languageVersion) {
        case LanguageVersion::v1800_2017:
            return KeywordVersion::v1800_2017;
        case LanguageVersion::v1800_2023:
            return KeywordVersion::v1800_2023;
    }
    SLANG_UNREACHABLE;
}